

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O2

Table * __thiscall Table::assign(Table *__return_storage_ptr__,Table *this)

{
  int i;
  long lVar1;
  Table *pTVar2;
  int j;
  long lVar3;
  
  Table(__return_storage_ptr__);
  pTVar2 = __return_storage_ptr__;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      pTVar2->table[0][lVar3].number = this->table[0][lVar3].number;
    }
    this = (Table *)(this->table + 1);
    pTVar2 = (Table *)(pTVar2->table + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Table Table::assign() {
    Table table = Table();
    for (int i = 0; i < HEIGHT; i++){
        for (int j = 0; j < WIDTH; j++) {
            table.table[i][j] = this->table[i][j];
        }
    }
    return table;
}